

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::~ArrayBuilder
          (ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *this)

{
  CppTypeName *pCVar1;
  RemoveConst<capnp::(anonymous_namespace)::CppTypeName> *pRVar2;
  CppTypeName *pCVar3;
  
  pCVar1 = this->ptr;
  if (pCVar1 != (CppTypeName *)0x0) {
    pRVar2 = this->pos;
    pCVar3 = this->endPtr;
    this->endPtr = (CppTypeName *)0x0;
    this->ptr = (CppTypeName *)0x0;
    this->pos = (RemoveConst<capnp::(anonymous_namespace)::CppTypeName> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pCVar1,0x40,(long)pRVar2 - (long)pCVar1 >> 6,
               (long)pCVar3 - (long)pCVar1 >> 6,
               ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }